

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_NtkIsSeq(Cba_Ntk_t *p)

{
  byte bVar1;
  int iVar2;
  Cba_Ntk_t *p_00;
  int iVar3;
  int i;
  
  if ((p->field_0x14 & 4) == 0) {
    iVar3 = 0;
    if ((p->field_0x14 & 2) == 0) {
      iVar3 = 1;
      for (i = 1; i < (p->vObjType).nSize; i = i + 1) {
        iVar2 = Cba_ObjIsBox(p,i);
        if (iVar2 != 0) {
          iVar2 = Cba_ObjIsBoxUser(p,i);
          if (iVar2 == 0) {
            iVar2 = Cba_ObjIsSeq(p,i);
          }
          else {
            p_00 = Cba_ObjNtk(p,i);
            iVar2 = Cba_NtkIsSeq(p_00);
          }
          if (iVar2 != 0) {
            bVar1 = 4;
            goto LAB_0033b556;
          }
        }
      }
      iVar3 = 0;
      bVar1 = 2;
LAB_0033b556:
      p->field_0x14 = p->field_0x14 | bVar1;
    }
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static inline int Cba_NtkIsSeq( Cba_Ntk_t * p )
{
    int iObj;
    if ( p->fSeq )
        return 1;
    if ( p->fComb )
        return 0;
    assert( !p->fSeq && !p->fComb );
    Cba_NtkForEachBox( p, iObj )
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            if ( Cba_NtkIsSeq( Cba_ObjNtk(p, iObj) ) )
            {
                p->fSeq = 1;
                return 1;
            }
        }
        else if ( Cba_ObjIsSeq(p, iObj) )
        {
            p->fSeq = 1;
            return 1;
        }
    p->fComb = 1;
    return 0;
}